

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * decodepsbt(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_ffffffffffffe608;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_ffffffffffffe610;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe620;
  string *in_stack_ffffffffffffe638;
  RPCResult *in_stack_ffffffffffffe640;
  RPCResult *in_stack_ffffffffffffe648;
  char *in_stack_ffffffffffffe650;
  undefined7 in_stack_ffffffffffffe658;
  undefined1 in_stack_ffffffffffffe65f;
  string *in_stack_ffffffffffffe660;
  undefined7 in_stack_ffffffffffffe668;
  undefined1 in_stack_ffffffffffffe66f;
  undefined4 in_stack_ffffffffffffe670;
  Type in_stack_ffffffffffffe674;
  string *in_stack_ffffffffffffe678;
  undefined4 in_stack_ffffffffffffe680;
  Type in_stack_ffffffffffffe684;
  undefined4 in_stack_ffffffffffffe688;
  Type in_stack_ffffffffffffe68c;
  RPCResult *in_stack_ffffffffffffe690;
  RPCExamples *in_stack_ffffffffffffe750;
  RPCResults *in_stack_ffffffffffffe758;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe760;
  undefined1 *puVar2;
  string *in_stack_ffffffffffffe768;
  string *in_stack_ffffffffffffe770;
  RPCHelpMan *in_stack_ffffffffffffe778;
  undefined1 *local_1880;
  undefined1 *local_1868;
  undefined1 *local_1850;
  undefined1 *local_1838;
  undefined1 *local_1820;
  undefined1 *local_1808;
  undefined1 *local_17f0;
  RPCMethodImpl *fun;
  undefined1 local_1490 [38];
  allocator<char> local_146a [2];
  pointer local_1468;
  pointer pRStack_1460;
  pointer local_1458;
  allocator<char> local_144b;
  allocator<char> local_144a [32];
  allocator<char> local_142a;
  undefined1 local_1429 [30];
  allocator<char> local_140b [19];
  undefined8 local_13f8;
  allocator<char> local_13ea;
  allocator<char> local_13e9;
  size_type local_13e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_13e0;
  allocator<char> local_13ca;
  allocator<char> local_13c9;
  _Alloc_hider local_13c8;
  size_type sStack_13c0;
  undefined1 local_13b8 [15];
  allocator<char> local_13a9;
  pointer local_13a8;
  pointer pbStack_13a0;
  pointer local_1398;
  allocator<char> local_138a;
  allocator<char> local_1389 [31];
  allocator<char> local_136a;
  allocator<char> local_1369 [31];
  allocator<char> local_134a;
  allocator<char> local_1349;
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined8 local_1338;
  allocator<char> local_132c;
  allocator<char> local_132b [3];
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  allocator<char> local_130a;
  allocator<char> local_1309;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 local_12f8;
  allocator<char> local_12ea;
  allocator<char> local_12e9;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  allocator<char> local_12ca;
  allocator<char> local_12c9 [31];
  allocator<char> local_12aa;
  allocator<char> local_12a9 [30];
  allocator<char> local_128b;
  allocator<char> local_128a [2];
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  allocator<char> local_1262;
  allocator<char> local_1261 [31];
  allocator<char> local_1242;
  allocator<char> local_1241 [31];
  allocator<char> local_1222;
  allocator<char> local_1221 [32];
  allocator<char> local_1201;
  undefined4 local_1200;
  allocator<char> local_11f9 [31];
  allocator<char> local_11da;
  allocator<char> local_11d9 [257];
  undefined1 local_10d8 [136];
  undefined1 local_1050 [80];
  undefined8 local_1000;
  undefined1 local_f10 [544];
  undefined1 local_cf0 [64];
  undefined1 local_cb0 [136];
  undefined1 local_c28 [320];
  undefined1 local_ae8 [408];
  undefined1 local_950 [64];
  undefined1 local_910 [136];
  undefined1 local_888 [128];
  undefined1 local_808 [136];
  undefined1 local_780 [64];
  undefined1 local_740 [1088];
  undefined1 local_300 [200];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_1200 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe618,(Optional *)in_stack_ffffffffffffe610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe620);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe608);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                 in_stack_ffffffffffffe678,in_stack_ffffffffffffe674,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe66f,in_stack_ffffffffffffe668),
                 in_stack_ffffffffffffe660,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658));
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_ffffffffffffe608);
  __l._M_len._0_7_ = in_stack_ffffffffffffe658;
  __l._M_array = (iterator)in_stack_ffffffffffffe650;
  __l._M_len._7_1_ = in_stack_ffffffffffffe65f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe648,__l,
             (allocator_type *)in_stack_ffffffffffffe640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_1288 = 0;
  uStack_1280 = 0;
  local_1278 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe608);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe658;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe650;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe65f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe648,__l_00,
             (allocator_type *)in_stack_ffffffffffffe640);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_12e8 = 0;
  uStack_12e0 = 0;
  local_12d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_1308 = 0;
  uStack_1300 = 0;
  local_12f8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_1328 = 0;
  uStack_1320 = 0;
  local_1318 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe608);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe658;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe650;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe65f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe648,__l_01,
             (allocator_type *)in_stack_ffffffffffffe640);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe608);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe658;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe650;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe65f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe648,__l_02,
             (allocator_type *)in_stack_ffffffffffffe640);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_1348 = 0;
  uStack_1340 = 0;
  local_1338 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_13a8 = (pointer)0x0;
  pbStack_13a0 = (pointer)0x0;
  local_1398 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_13c8._M_p = (pointer)0x0;
  sStack_13c0 = 0;
  local_13b8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_13e8 = 0;
  aStack_13e0._M_allocated_capacity = 0;
  aStack_13e0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_140b[3] = (allocator<char>)0x0;
  local_140b[4] = (allocator<char>)0x0;
  local_140b[5] = (allocator<char>)0x0;
  local_140b[6] = (allocator<char>)0x0;
  local_140b[7] = (allocator<char>)0x0;
  local_140b[8] = (allocator<char>)0x0;
  local_140b[9] = (allocator<char>)0x0;
  local_140b[10] = (allocator<char>)0x0;
  local_140b[0xb] = (allocator<char>)0x0;
  local_140b[0xc] = (allocator<char>)0x0;
  local_140b[0xd] = (allocator<char>)0x0;
  local_140b[0xe] = (allocator<char>)0x0;
  local_140b[0xf] = (allocator<char>)0x0;
  local_140b[0x10] = (allocator<char>)0x0;
  local_140b[0x11] = (allocator<char>)0x0;
  local_140b[0x12] = (allocator<char>)0x0;
  local_13f8._0_1_ = '\0';
  local_13f8._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe608);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffe658;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe650;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffe65f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe648,__l_03,
             (allocator_type *)in_stack_ffffffffffffe640);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe608);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffe658;
  __l_04._M_array = (iterator)in_stack_ffffffffffffe650;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffe65f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe648,__l_04,
             (allocator_type *)in_stack_ffffffffffffe640);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  fun = (RPCMethodImpl *)local_1429;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_144a[2] = (allocator<char>)0x0;
  local_144a[3] = (allocator<char>)0x0;
  local_144a[4] = (allocator<char>)0x0;
  local_144a[5] = (allocator<char>)0x0;
  local_144a[6] = (allocator<char>)0x0;
  local_144a[7] = (allocator<char>)0x0;
  local_144a[8] = (allocator<char>)0x0;
  local_144a[9] = (allocator<char>)0x0;
  local_144a[10] = (allocator<char>)0x0;
  local_144a[0xb] = (allocator<char>)0x0;
  local_144a[0xc] = (allocator<char>)0x0;
  local_144a[0xd] = (allocator<char>)0x0;
  local_144a[0xe] = (allocator<char>)0x0;
  local_144a[0xf] = (allocator<char>)0x0;
  local_144a[0x10] = (allocator<char>)0x0;
  local_144a[0x11] = (allocator<char>)0x0;
  local_144a[0x12] = (allocator<char>)0x0;
  local_144a[0x13] = (allocator<char>)0x0;
  local_144a[0x14] = (allocator<char>)0x0;
  local_144a[0x15] = (allocator<char>)0x0;
  local_144a[0x16] = (allocator<char>)0x0;
  local_144a[0x17] = (allocator<char>)0x0;
  local_144a[0x18] = (allocator<char>)0x0;
  local_144a[0x19] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe608);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffe658;
  __l_05._M_array = (iterator)in_stack_ffffffffffffe650;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffe65f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe648,__l_05,
             (allocator_type *)in_stack_ffffffffffffe640);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  RPCResult::RPCResult(in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  RPCResult::RPCResult(in_stack_ffffffffffffe648,in_stack_ffffffffffffe640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  local_1468 = (pointer)0x0;
  pRStack_1460 = (pointer)0x0;
  local_1458 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe608);
  in_stack_ffffffffffffe608 =
       (allocator<RPCResult> *)((ulong)in_stack_ffffffffffffe608 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
             in_stack_ffffffffffffe684,in_stack_ffffffffffffe678,
             SUB41(in_stack_ffffffffffffe674 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe66f,in_stack_ffffffffffffe668),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe660,
             (bool)in_stack_ffffffffffffe65f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffe608);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffe658;
  __l_06._M_array = (iterator)in_stack_ffffffffffffe650;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffe65f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe648,__l_06,
             (allocator_type *)in_stack_ffffffffffffe640);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe690,in_stack_ffffffffffffe68c,
             (string *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
             in_stack_ffffffffffffe678,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
             (bool)in_stack_ffffffffffffe66f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe68c,in_stack_ffffffffffffe688),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe65f,in_stack_ffffffffffffe658),in_stack_ffffffffffffe650
             ,(allocator<char> *)in_stack_ffffffffffffe648);
  HelpExampleCli((string *)in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_ffffffffffffe608,(string *)0x6a442d);
  this = (RPCArg *)local_1490;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<decodepsbt()::__0,void>
            (in_stack_ffffffffffffe618,in_stack_ffffffffffffe610);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe778,in_stack_ffffffffffffe770,in_stack_ffffffffffffe768,
             in_stack_ffffffffffffe760,in_stack_ffffffffffffe758,in_stack_ffffffffffffe750,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1490 + 0x25));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_146a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_17f0 = local_300;
  do {
    local_17f0 = local_17f0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_17f0 != local_740);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_144b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_144a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1808 = local_1050;
  do {
    local_1808 = local_1808 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1808 != local_10d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_142a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1429);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1429 + 0x1d));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_140b);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1820 = local_c28;
  do {
    local_1820 = local_1820 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1820 != local_cb0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1838 = local_cf0;
  do {
    local_1838 = local_1838 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1838 != local_f10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_13ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_13e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_13ca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_13c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_13b8 + 0xe));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_13a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_138a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1389);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_136a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1369);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_134a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1349);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_132c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_132b);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1850 = local_888;
  do {
    local_1850 = local_1850 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1850 != local_910);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1868 = local_950;
  do {
    local_1868 = local_1868 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1868 != local_ae8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_130a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1309);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_12ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_12e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_12ca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_12c9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_12aa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_12a9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_128b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_128a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_808;
  local_1880 = local_780;
  do {
    local_1880 = local_1880 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1880 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe618);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1262);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1261);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1242);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1241);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1222);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1221);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe618);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1201);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_11f9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_11da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_11d9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan decodepsbt()
{
    return RPCHelpMan{
        "decodepsbt",
        "Return a JSON object representing the serialized, base64-encoded partially signed Bitcoin transaction.",
                {
                    {"psbt", RPCArg::Type::STR, RPCArg::Optional::NO, "The PSBT base64 string"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::OBJ, "tx", "The decoded network-serialized unsigned transaction.",
                        {
                            {RPCResult::Type::ELISION, "", "The layout is the same as the output of decoderawtransaction."},
                        }},
                        {RPCResult::Type::ARR, "global_xpubs", "",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR, "xpub", "The extended public key this path corresponds to"},
                                {RPCResult::Type::STR_HEX, "master_fingerprint", "The fingerprint of the master key"},
                                {RPCResult::Type::STR, "path", "The path"},
                            }},
                        }},
                        {RPCResult::Type::NUM, "psbt_version", "The PSBT version number. Not to be confused with the unsigned transaction version"},
                        {RPCResult::Type::ARR, "proprietary", "The global proprietary map",
                        {
                            {RPCResult::Type::OBJ, "", "",
                            {
                                {RPCResult::Type::STR_HEX, "identifier", "The hex string for the proprietary identifier"},
                                {RPCResult::Type::NUM, "subtype", "The number for the subtype"},
                                {RPCResult::Type::STR_HEX, "key", "The hex for the key"},
                                {RPCResult::Type::STR_HEX, "value", "The hex for the value"},
                            }},
                        }},
                        {RPCResult::Type::OBJ_DYN, "unknown", "The unknown global fields",
                        {
                             {RPCResult::Type::STR_HEX, "key", "(key-value pair) An unknown key-value pair"},
                        }},
                        decodepsbt_inputs,
                        decodepsbt_outputs,
                        {RPCResult::Type::STR_AMOUNT, "fee", /*optional=*/true, "The transaction fee paid if all UTXOs slots in the PSBT have been filled."},
                    }
                },
                RPCExamples{
                    HelpExampleCli("decodepsbt", "\"psbt\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    // Unserialize the transactions
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, request.params[0].get_str(), error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    UniValue result(UniValue::VOBJ);

    // Add the decoded tx
    UniValue tx_univ(UniValue::VOBJ);
    TxToUniv(CTransaction(*psbtx.tx), /*block_hash=*/uint256(), /*entry=*/tx_univ, /*include_hex=*/false);
    result.pushKV("tx", std::move(tx_univ));

    // Add the global xpubs
    UniValue global_xpubs(UniValue::VARR);
    for (std::pair<KeyOriginInfo, std::set<CExtPubKey>> xpub_pair : psbtx.m_xpubs) {
        for (auto& xpub : xpub_pair.second) {
            std::vector<unsigned char> ser_xpub;
            ser_xpub.assign(BIP32_EXTKEY_WITH_VERSION_SIZE, 0);
            xpub.EncodeWithVersion(ser_xpub.data());

            UniValue keypath(UniValue::VOBJ);
            keypath.pushKV("xpub", EncodeBase58Check(ser_xpub));
            keypath.pushKV("master_fingerprint", HexStr(Span<unsigned char>(xpub_pair.first.fingerprint, xpub_pair.first.fingerprint + 4)));
            keypath.pushKV("path", WriteHDKeypath(xpub_pair.first.path));
            global_xpubs.push_back(std::move(keypath));
        }
    }
    result.pushKV("global_xpubs", std::move(global_xpubs));

    // PSBT version
    result.pushKV("psbt_version", static_cast<uint64_t>(psbtx.GetVersion()));

    // Proprietary
    UniValue proprietary(UniValue::VARR);
    for (const auto& entry : psbtx.m_proprietary) {
        UniValue this_prop(UniValue::VOBJ);
        this_prop.pushKV("identifier", HexStr(entry.identifier));
        this_prop.pushKV("subtype", entry.subtype);
        this_prop.pushKV("key", HexStr(entry.key));
        this_prop.pushKV("value", HexStr(entry.value));
        proprietary.push_back(std::move(this_prop));
    }
    result.pushKV("proprietary", std::move(proprietary));

    // Unknown data
    UniValue unknowns(UniValue::VOBJ);
    for (auto entry : psbtx.unknown) {
        unknowns.pushKV(HexStr(entry.first), HexStr(entry.second));
    }
    result.pushKV("unknown", std::move(unknowns));

    // inputs
    CAmount total_in = 0;
    bool have_all_utxos = true;
    UniValue inputs(UniValue::VARR);
    for (unsigned int i = 0; i < psbtx.inputs.size(); ++i) {
        const PSBTInput& input = psbtx.inputs[i];
        UniValue in(UniValue::VOBJ);
        // UTXOs
        bool have_a_utxo = false;
        CTxOut txout;
        if (!input.witness_utxo.IsNull()) {
            txout = input.witness_utxo;

            UniValue o(UniValue::VOBJ);
            ScriptToUniv(txout.scriptPubKey, /*out=*/o, /*include_hex=*/true, /*include_address=*/true);

            UniValue out(UniValue::VOBJ);
            out.pushKV("amount", ValueFromAmount(txout.nValue));
            out.pushKV("scriptPubKey", std::move(o));

            in.pushKV("witness_utxo", std::move(out));

            have_a_utxo = true;
        }
        if (input.non_witness_utxo) {
            txout = input.non_witness_utxo->vout[psbtx.tx->vin[i].prevout.n];

            UniValue non_wit(UniValue::VOBJ);
            TxToUniv(*input.non_witness_utxo, /*block_hash=*/uint256(), /*entry=*/non_wit, /*include_hex=*/false);
            in.pushKV("non_witness_utxo", std::move(non_wit));

            have_a_utxo = true;
        }
        if (have_a_utxo) {
            if (MoneyRange(txout.nValue) && MoneyRange(total_in + txout.nValue)) {
                total_in += txout.nValue;
            } else {
                // Hack to just not show fee later
                have_all_utxos = false;
            }
        } else {
            have_all_utxos = false;
        }

        // Partial sigs
        if (!input.partial_sigs.empty()) {
            UniValue partial_sigs(UniValue::VOBJ);
            for (const auto& sig : input.partial_sigs) {
                partial_sigs.pushKV(HexStr(sig.second.first), HexStr(sig.second.second));
            }
            in.pushKV("partial_signatures", std::move(partial_sigs));
        }

        // Sighash
        if (input.sighash_type != std::nullopt) {
            in.pushKV("sighash", SighashToStr((unsigned char)*input.sighash_type));
        }

        // Redeem script and witness script
        if (!input.redeem_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(input.redeem_script, /*out=*/r);
            in.pushKV("redeem_script", std::move(r));
        }
        if (!input.witness_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(input.witness_script, /*out=*/r);
            in.pushKV("witness_script", std::move(r));
        }

        // keypaths
        if (!input.hd_keypaths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (auto entry : input.hd_keypaths) {
                UniValue keypath(UniValue::VOBJ);
                keypath.pushKV("pubkey", HexStr(entry.first));

                keypath.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(entry.second.fingerprint)));
                keypath.pushKV("path", WriteHDKeypath(entry.second.path));
                keypaths.push_back(std::move(keypath));
            }
            in.pushKV("bip32_derivs", std::move(keypaths));
        }

        // Final scriptSig and scriptwitness
        if (!input.final_script_sig.empty()) {
            UniValue scriptsig(UniValue::VOBJ);
            scriptsig.pushKV("asm", ScriptToAsmStr(input.final_script_sig, true));
            scriptsig.pushKV("hex", HexStr(input.final_script_sig));
            in.pushKV("final_scriptSig", std::move(scriptsig));
        }
        if (!input.final_script_witness.IsNull()) {
            UniValue txinwitness(UniValue::VARR);
            for (const auto& item : input.final_script_witness.stack) {
                txinwitness.push_back(HexStr(item));
            }
            in.pushKV("final_scriptwitness", std::move(txinwitness));
        }

        // Ripemd160 hash preimages
        if (!input.ripemd160_preimages.empty()) {
            UniValue ripemd160_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.ripemd160_preimages) {
                ripemd160_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("ripemd160_preimages", std::move(ripemd160_preimages));
        }

        // Sha256 hash preimages
        if (!input.sha256_preimages.empty()) {
            UniValue sha256_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.sha256_preimages) {
                sha256_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("sha256_preimages", std::move(sha256_preimages));
        }

        // Hash160 hash preimages
        if (!input.hash160_preimages.empty()) {
            UniValue hash160_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.hash160_preimages) {
                hash160_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("hash160_preimages", std::move(hash160_preimages));
        }

        // Hash256 hash preimages
        if (!input.hash256_preimages.empty()) {
            UniValue hash256_preimages(UniValue::VOBJ);
            for (const auto& [hash, preimage] : input.hash256_preimages) {
                hash256_preimages.pushKV(HexStr(hash), HexStr(preimage));
            }
            in.pushKV("hash256_preimages", std::move(hash256_preimages));
        }

        // Taproot key path signature
        if (!input.m_tap_key_sig.empty()) {
            in.pushKV("taproot_key_path_sig", HexStr(input.m_tap_key_sig));
        }

        // Taproot script path signatures
        if (!input.m_tap_script_sigs.empty()) {
            UniValue script_sigs(UniValue::VARR);
            for (const auto& [pubkey_leaf, sig] : input.m_tap_script_sigs) {
                const auto& [xonly, leaf_hash] = pubkey_leaf;
                UniValue sigobj(UniValue::VOBJ);
                sigobj.pushKV("pubkey", HexStr(xonly));
                sigobj.pushKV("leaf_hash", HexStr(leaf_hash));
                sigobj.pushKV("sig", HexStr(sig));
                script_sigs.push_back(std::move(sigobj));
            }
            in.pushKV("taproot_script_path_sigs", std::move(script_sigs));
        }

        // Taproot leaf scripts
        if (!input.m_tap_scripts.empty()) {
            UniValue tap_scripts(UniValue::VARR);
            for (const auto& [leaf, control_blocks] : input.m_tap_scripts) {
                const auto& [script, leaf_ver] = leaf;
                UniValue script_info(UniValue::VOBJ);
                script_info.pushKV("script", HexStr(script));
                script_info.pushKV("leaf_ver", leaf_ver);
                UniValue control_blocks_univ(UniValue::VARR);
                for (const auto& control_block : control_blocks) {
                    control_blocks_univ.push_back(HexStr(control_block));
                }
                script_info.pushKV("control_blocks", std::move(control_blocks_univ));
                tap_scripts.push_back(std::move(script_info));
            }
            in.pushKV("taproot_scripts", std::move(tap_scripts));
        }

        // Taproot bip32 keypaths
        if (!input.m_tap_bip32_paths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (const auto& [xonly, leaf_origin] : input.m_tap_bip32_paths) {
                const auto& [leaf_hashes, origin] = leaf_origin;
                UniValue path_obj(UniValue::VOBJ);
                path_obj.pushKV("pubkey", HexStr(xonly));
                path_obj.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(origin.fingerprint)));
                path_obj.pushKV("path", WriteHDKeypath(origin.path));
                UniValue leaf_hashes_arr(UniValue::VARR);
                for (const auto& leaf_hash : leaf_hashes) {
                    leaf_hashes_arr.push_back(HexStr(leaf_hash));
                }
                path_obj.pushKV("leaf_hashes", std::move(leaf_hashes_arr));
                keypaths.push_back(std::move(path_obj));
            }
            in.pushKV("taproot_bip32_derivs", std::move(keypaths));
        }

        // Taproot internal key
        if (!input.m_tap_internal_key.IsNull()) {
            in.pushKV("taproot_internal_key", HexStr(input.m_tap_internal_key));
        }

        // Write taproot merkle root
        if (!input.m_tap_merkle_root.IsNull()) {
            in.pushKV("taproot_merkle_root", HexStr(input.m_tap_merkle_root));
        }

        // Proprietary
        if (!input.m_proprietary.empty()) {
            UniValue proprietary(UniValue::VARR);
            for (const auto& entry : input.m_proprietary) {
                UniValue this_prop(UniValue::VOBJ);
                this_prop.pushKV("identifier", HexStr(entry.identifier));
                this_prop.pushKV("subtype", entry.subtype);
                this_prop.pushKV("key", HexStr(entry.key));
                this_prop.pushKV("value", HexStr(entry.value));
                proprietary.push_back(std::move(this_prop));
            }
            in.pushKV("proprietary", std::move(proprietary));
        }

        // Unknown data
        if (input.unknown.size() > 0) {
            UniValue unknowns(UniValue::VOBJ);
            for (auto entry : input.unknown) {
                unknowns.pushKV(HexStr(entry.first), HexStr(entry.second));
            }
            in.pushKV("unknown", std::move(unknowns));
        }

        inputs.push_back(std::move(in));
    }
    result.pushKV("inputs", std::move(inputs));

    // outputs
    CAmount output_value = 0;
    UniValue outputs(UniValue::VARR);
    for (unsigned int i = 0; i < psbtx.outputs.size(); ++i) {
        const PSBTOutput& output = psbtx.outputs[i];
        UniValue out(UniValue::VOBJ);
        // Redeem script and witness script
        if (!output.redeem_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(output.redeem_script, /*out=*/r);
            out.pushKV("redeem_script", std::move(r));
        }
        if (!output.witness_script.empty()) {
            UniValue r(UniValue::VOBJ);
            ScriptToUniv(output.witness_script, /*out=*/r);
            out.pushKV("witness_script", std::move(r));
        }

        // keypaths
        if (!output.hd_keypaths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (auto entry : output.hd_keypaths) {
                UniValue keypath(UniValue::VOBJ);
                keypath.pushKV("pubkey", HexStr(entry.first));
                keypath.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(entry.second.fingerprint)));
                keypath.pushKV("path", WriteHDKeypath(entry.second.path));
                keypaths.push_back(std::move(keypath));
            }
            out.pushKV("bip32_derivs", std::move(keypaths));
        }

        // Taproot internal key
        if (!output.m_tap_internal_key.IsNull()) {
            out.pushKV("taproot_internal_key", HexStr(output.m_tap_internal_key));
        }

        // Taproot tree
        if (!output.m_tap_tree.empty()) {
            UniValue tree(UniValue::VARR);
            for (const auto& [depth, leaf_ver, script] : output.m_tap_tree) {
                UniValue elem(UniValue::VOBJ);
                elem.pushKV("depth", (int)depth);
                elem.pushKV("leaf_ver", (int)leaf_ver);
                elem.pushKV("script", HexStr(script));
                tree.push_back(std::move(elem));
            }
            out.pushKV("taproot_tree", std::move(tree));
        }

        // Taproot bip32 keypaths
        if (!output.m_tap_bip32_paths.empty()) {
            UniValue keypaths(UniValue::VARR);
            for (const auto& [xonly, leaf_origin] : output.m_tap_bip32_paths) {
                const auto& [leaf_hashes, origin] = leaf_origin;
                UniValue path_obj(UniValue::VOBJ);
                path_obj.pushKV("pubkey", HexStr(xonly));
                path_obj.pushKV("master_fingerprint", strprintf("%08x", ReadBE32(origin.fingerprint)));
                path_obj.pushKV("path", WriteHDKeypath(origin.path));
                UniValue leaf_hashes_arr(UniValue::VARR);
                for (const auto& leaf_hash : leaf_hashes) {
                    leaf_hashes_arr.push_back(HexStr(leaf_hash));
                }
                path_obj.pushKV("leaf_hashes", std::move(leaf_hashes_arr));
                keypaths.push_back(std::move(path_obj));
            }
            out.pushKV("taproot_bip32_derivs", std::move(keypaths));
        }

        // Proprietary
        if (!output.m_proprietary.empty()) {
            UniValue proprietary(UniValue::VARR);
            for (const auto& entry : output.m_proprietary) {
                UniValue this_prop(UniValue::VOBJ);
                this_prop.pushKV("identifier", HexStr(entry.identifier));
                this_prop.pushKV("subtype", entry.subtype);
                this_prop.pushKV("key", HexStr(entry.key));
                this_prop.pushKV("value", HexStr(entry.value));
                proprietary.push_back(std::move(this_prop));
            }
            out.pushKV("proprietary", std::move(proprietary));
        }

        // Unknown data
        if (output.unknown.size() > 0) {
            UniValue unknowns(UniValue::VOBJ);
            for (auto entry : output.unknown) {
                unknowns.pushKV(HexStr(entry.first), HexStr(entry.second));
            }
            out.pushKV("unknown", std::move(unknowns));
        }

        outputs.push_back(std::move(out));

        // Fee calculation
        if (MoneyRange(psbtx.tx->vout[i].nValue) && MoneyRange(output_value + psbtx.tx->vout[i].nValue)) {
            output_value += psbtx.tx->vout[i].nValue;
        } else {
            // Hack to just not show fee later
            have_all_utxos = false;
        }
    }
    result.pushKV("outputs", std::move(outputs));
    if (have_all_utxos) {
        result.pushKV("fee", ValueFromAmount(total_in - output_value));
    }

    return result;
},
    };
}